

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O1

UINT8 DecompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,
                       PCM_CMP_INF *cmprInfo)

{
  short *psVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT16 UVar4;
  PCM_COMPR_TBL *pPVar5;
  char cVar6;
  bool bVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  short sVar15;
  uint uVar16;
  ushort uVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  UINT8 *pUVar22;
  char cVar23;
  ushort uVar24;
  UINT8 *pUVar25;
  UINT8 UVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  
  if (cmprInfo->comprType == '\x01') {
    bVar12 = cmprInfo->bitsDec;
    uVar10 = bVar12 + 7 >> 3;
    if (uVar10 == 2) {
      pPVar5 = cmprInfo->comprTbl;
      if (pPVar5->valueCount != 0) {
        UVar26 = '\x11';
        if ((bVar12 == pPVar5->bitsDec) && (bVar2 = cmprInfo->bitsCmp, bVar2 == pPVar5->bitsCmp)) {
          UVar26 = '\0';
          uVar14 = ((ulong)inLen << 4) / (ulong)bVar2;
          uVar21 = (ulong)outLen;
          if ((uint)uVar14 < outLen) {
            uVar21 = uVar14;
          }
          bVar7 = true;
          if ((int)uVar21 == 0) goto LAB_0010fb8a;
          pUVar25 = (pPVar5->values).d8;
          pUVar22 = outData + (uVar21 & 0xffffffff);
          uVar10 = (uint)cmprInfo->baseVal;
          uVar8 = 0;
          do {
            if (bVar2 == 0) {
              uVar14 = 0;
            }
            else {
              sVar18 = 0;
              uVar9 = (ushort)bVar2;
              uVar14 = 0;
              do {
                uVar24 = 8;
                if (uVar9 < 8) {
                  uVar24 = uVar9;
                }
                uVar8 = uVar8 + uVar24;
                uVar11 = (uint)*inData << ((byte)uVar8 & 0x1f);
                if (7 < uVar8) {
                  inData = inData + 1;
                  uVar8 = uVar8 - 8;
                  if (uVar8 == 0) {
                    uVar8 = 0;
                  }
                  else {
                    uVar11 = uVar11 | (uint)*inData << ((byte)uVar8 & 0x1f);
                  }
                }
                uVar9 = uVar9 - uVar24;
                uVar14 = (ulong)((uint)uVar14 |
                                (uVar11 >> 8 & ~(-1 << ((byte)uVar24 & 0x1f))) <<
                                ((byte)sVar18 & 0x1f));
                sVar18 = sVar18 + uVar24;
              } while (uVar9 != 0);
            }
            uVar10 = uVar10 + *(ushort *)(pUVar25 + uVar14 * 2) & (-1 << (bVar12 & 0x1f) ^ 0xffffU);
            *(short *)outData = (short)uVar10;
            outData = outData + 2;
          } while (outData < pUVar22);
          goto LAB_0010fb88;
        }
        goto LAB_0010f701;
      }
    }
    else {
      if (uVar10 != 1) goto LAB_0010f590;
      pPVar5 = cmprInfo->comprTbl;
      if (pPVar5->valueCount != 0) {
        UVar26 = '\x11';
        if ((bVar12 != pPVar5->bitsDec) || (bVar2 = cmprInfo->bitsCmp, bVar2 != pPVar5->bitsCmp))
        goto LAB_0010f701;
        UVar26 = '\0';
        uVar14 = ((ulong)inLen << 3) / (ulong)bVar2;
        uVar21 = (ulong)outLen;
        if ((uint)uVar14 < outLen) {
          uVar21 = uVar14 & 0xffffffff;
        }
        bVar7 = true;
        if ((int)uVar21 == 0) goto LAB_0010fb8a;
        pUVar25 = (pPVar5->values).d8;
        pUVar22 = outData + uVar21;
        uVar10 = (uint)cmprInfo->baseVal;
        uVar8 = 0;
        do {
          if (bVar2 == 0) {
            uVar14 = 0;
          }
          else {
            sVar18 = 0;
            uVar9 = (ushort)bVar2;
            uVar14 = 0;
            do {
              uVar24 = 8;
              if (uVar9 < 8) {
                uVar24 = uVar9;
              }
              uVar8 = uVar8 + uVar24;
              uVar11 = (uint)*inData << ((byte)uVar8 & 0x1f);
              if (7 < uVar8) {
                inData = inData + 1;
                uVar8 = uVar8 - 8;
                if (uVar8 == 0) {
                  uVar8 = 0;
                }
                else {
                  uVar11 = uVar11 | (uint)*inData << ((byte)uVar8 & 0x1f);
                }
              }
              uVar9 = uVar9 - uVar24;
              uVar14 = (ulong)((uint)uVar14 |
                              (uVar11 >> 8 & ~(-1 << ((byte)uVar24 & 0x1f))) <<
                              ((byte)sVar18 & 0x1f));
              sVar18 = sVar18 + uVar24;
            } while (uVar9 != 0);
            uVar14 = uVar14 & 0xffff;
          }
          uVar10 = uVar10 + pUVar25[uVar14] & ~(-1 << (bVar12 & 0x1f));
          *outData = (UINT8)uVar10;
          outData = outData + 1;
        } while (outData < pUVar22);
        goto LAB_0010fb88;
      }
    }
LAB_0010f6fe:
    UVar26 = '\x10';
LAB_0010f701:
    bVar7 = false;
  }
  else {
    if (cmprInfo->comprType != '\0') {
      return 0x80;
    }
    bVar12 = cmprInfo->bitsDec;
    uVar10 = bVar12 + 7 >> 3;
    if (uVar10 == 2) {
      UVar3 = cmprInfo->subType;
      bVar2 = cmprInfo->bitsCmp;
      uVar8 = (ushort)bVar2;
      UVar4 = cmprInfo->baseVal;
      if (UVar3 == '\x02') {
        pPVar5 = cmprInfo->comprTbl;
        if (pPVar5->valueCount == 0) goto LAB_0010f6fe;
        UVar26 = '\x11';
        if ((bVar12 != pPVar5->bitsDec) || (bVar2 != pPVar5->bitsCmp)) goto LAB_0010f701;
        pUVar25 = (pPVar5->values).d8;
      }
      else {
        pUVar25 = (UINT8 *)0x0;
      }
      uVar14 = ((ulong)inLen << 4) / (ulong)bVar2;
      uVar21 = (ulong)outLen;
      if ((uint)uVar14 < outLen) {
        uVar21 = uVar14;
      }
      psVar1 = (short *)(outData + (uVar21 & 0xffffffff));
      iVar19 = (int)uVar21;
      if (UVar3 == '\0') {
        if (iVar19 != 0) {
          uVar9 = 0;
          do {
            sVar18 = 0;
            sVar15 = 0;
            if (bVar2 != 0) {
              uVar10 = 0;
              uVar24 = uVar8;
              do {
                uVar17 = 8;
                if (uVar24 < 8) {
                  uVar17 = uVar24;
                }
                uVar9 = uVar9 + uVar17;
                uVar11 = (uint)*inData << ((byte)uVar9 & 0x1f);
                if (7 < uVar9) {
                  inData = inData + 1;
                  uVar9 = uVar9 - 8;
                  if (uVar9 == 0) {
                    uVar9 = 0;
                  }
                  else {
                    uVar11 = uVar11 | (uint)*inData << ((byte)uVar9 & 0x1f);
                  }
                }
                uVar24 = uVar24 - uVar17;
                bVar12 = (byte)sVar18;
                sVar18 = sVar18 + uVar17;
                uVar10 = uVar10 | (~(-1 << ((byte)uVar17 & 0x1f)) & 0xffffU & uVar11 >> 8) <<
                                  (bVar12 & 0x1f);
                sVar15 = (short)uVar10;
              } while (uVar24 != 0);
            }
            *(UINT16 *)outData = sVar15 + UVar4;
            outData = (UINT8 *)((long)outData + 2);
          } while (outData < psVar1);
        }
      }
      else if (UVar3 == '\x01') {
        if (iVar19 != 0) {
          uVar9 = 0;
          do {
            if (bVar2 == 0) {
              uVar10 = 0;
            }
            else {
              sVar18 = 0;
              uVar10 = 0;
              uVar24 = uVar8;
              do {
                uVar17 = 8;
                if (uVar24 < 8) {
                  uVar17 = uVar24;
                }
                uVar9 = uVar9 + uVar17;
                uVar11 = (uint)*inData << ((byte)uVar9 & 0x1f);
                if (7 < uVar9) {
                  inData = inData + 1;
                  uVar9 = uVar9 - 8;
                  if (uVar9 == 0) {
                    uVar9 = 0;
                  }
                  else {
                    uVar11 = uVar11 | (uint)*inData << ((byte)uVar9 & 0x1f);
                  }
                }
                uVar24 = uVar24 - uVar17;
                bVar13 = (byte)sVar18;
                sVar18 = sVar18 + uVar17;
                uVar10 = uVar10 | (~(-1 << ((byte)uVar17 & 0x1f)) & 0xffffU & uVar11 >> 8) <<
                                  (bVar13 & 0x1f);
              } while (uVar24 != 0);
            }
            *(UINT16 *)outData = (short)(uVar10 << (bVar12 - bVar2 & 0x1f)) + UVar4;
            outData = (UINT8 *)((long)outData + 2);
          } while (outData < psVar1);
        }
      }
      else if ((UVar3 == '\x02') && (iVar19 != 0)) {
        uVar9 = 0;
        do {
          if ((ulong)bVar2 == 0) {
            uVar14 = 0;
          }
          else {
            sVar18 = 0;
            uVar14 = 0;
            uVar24 = uVar8;
            do {
              uVar17 = 8;
              if (uVar24 < 8) {
                uVar17 = uVar24;
              }
              uVar9 = uVar9 + uVar17;
              uVar10 = (uint)*inData << ((byte)uVar9 & 0x1f);
              if (7 < uVar9) {
                inData = inData + 1;
                uVar9 = uVar9 - 8;
                if (uVar9 == 0) {
                  uVar9 = 0;
                }
                else {
                  uVar10 = uVar10 | (uint)*inData << ((byte)uVar9 & 0x1f);
                }
              }
              uVar24 = uVar24 - uVar17;
              bVar12 = (byte)sVar18;
              sVar18 = sVar18 + uVar17;
              uVar14 = (ulong)((uint)uVar14 |
                              (~(-1 << ((byte)uVar17 & 0x1f)) & 0xffffU & uVar10 >> 8) <<
                              (bVar12 & 0x1f));
            } while (uVar24 != 0);
          }
          *(short *)outData = *(short *)(pUVar25 + uVar14 * 2);
          outData = (UINT8 *)((long)outData + 2);
        } while (outData < psVar1);
      }
    }
    else {
      if (uVar10 != 1) {
LAB_0010f590:
        UVar26 = ' ';
        goto LAB_0010f701;
      }
      bVar2 = cmprInfo->bitsCmp;
      uVar10 = (uint)bVar2;
      UVar3 = cmprInfo->subType;
      if (UVar3 == '\x02') {
        pPVar5 = cmprInfo->comprTbl;
        if (pPVar5->valueCount == 0) goto LAB_0010f6fe;
        UVar26 = '\x11';
        if ((bVar12 != pPVar5->bitsDec) || (bVar2 != pPVar5->bitsCmp)) goto LAB_0010f701;
        pUVar25 = (pPVar5->values).d8;
      }
      else {
        pUVar25 = (UINT8 *)0x0;
      }
      uVar14 = ((ulong)inLen << 3) / (ulong)bVar2;
      uVar21 = (ulong)outLen;
      if ((uint)uVar14 < outLen) {
        uVar21 = uVar14;
      }
      pUVar22 = outData + (uVar21 & 0xffffffff);
      iVar19 = (int)uVar21;
      cVar6 = (char)cmprInfo->baseVal;
      if (UVar3 == '\0') {
        if (iVar19 != 0) {
          uVar11 = 0;
          do {
            sVar18 = 0;
            if (bVar2 == 0) {
              cVar23 = '\0';
            }
            else {
              uVar20 = 0;
              uVar27 = uVar10;
              do {
                uVar16 = 8;
                if ((ushort)uVar27 < 8) {
                  uVar16 = uVar27;
                }
                uVar11 = uVar11 + uVar16;
                uVar29 = (uint)*inData << ((byte)uVar11 & 0x1f);
                if (7 < (ushort)uVar11) {
                  inData = inData + 1;
                  uVar8 = (ushort)uVar11 - 8;
                  uVar11 = (uint)uVar8;
                  if (uVar8 == 0) {
                    uVar11 = 0;
                  }
                  else {
                    uVar29 = uVar29 | (uint)*inData << ((byte)uVar8 & 0x1f);
                  }
                }
                uVar27 = uVar27 - uVar16;
                bVar12 = (byte)sVar18;
                sVar18 = sVar18 + (short)uVar16;
                uVar20 = uVar20 | (~(-1 << ((byte)uVar16 & 0x1f)) & uVar29 >> 8) << (bVar12 & 0x1f);
                cVar23 = (char)uVar20;
              } while ((short)uVar27 != 0);
            }
            *outData = cVar23 + cVar6;
            outData = outData + 1;
          } while (outData < pUVar22);
        }
      }
      else if (UVar3 == '\x01') {
        if (iVar19 != 0) {
          uVar11 = 0;
          do {
            uVar27 = 0;
            if (bVar2 != 0) {
              uVar16 = 0;
              uVar20 = uVar10;
              do {
                uVar29 = 8;
                if ((ushort)uVar20 < 8) {
                  uVar29 = uVar20;
                }
                uVar11 = uVar11 + uVar29;
                uVar28 = (uint)*inData << ((byte)uVar11 & 0x1f);
                if (7 < (ushort)uVar11) {
                  inData = inData + 1;
                  uVar8 = (ushort)uVar11 - 8;
                  uVar11 = (uint)uVar8;
                  if (uVar8 == 0) {
                    uVar11 = 0;
                  }
                  else {
                    uVar28 = uVar28 | (uint)*inData << ((byte)uVar8 & 0x1f);
                  }
                }
                uVar20 = uVar20 - uVar29;
                bVar13 = (byte)uVar27;
                uVar27 = (uVar27 & 0xffff) + (uVar29 & 0xffff);
                uVar16 = uVar16 | (~(-1 << ((byte)uVar29 & 0x1f)) & uVar28 >> 8) << (bVar13 & 0x1f);
              } while ((short)uVar20 != 0);
              uVar27 = uVar16 & 0xffff;
            }
            *outData = (char)(uVar27 << (bVar12 - bVar2 & 0x1f)) + cVar6;
            outData = outData + 1;
          } while (outData < pUVar22);
        }
      }
      else if ((UVar3 == '\x02') && (iVar19 != 0)) {
        uVar11 = 0;
        do {
          if ((ulong)bVar2 == 0) {
            uVar14 = 0;
          }
          else {
            uVar20 = 0;
            uVar16 = 0;
            uVar27 = uVar10;
            do {
              uVar29 = 8;
              if ((ushort)uVar27 < 8) {
                uVar29 = uVar27;
              }
              uVar11 = uVar11 + uVar29;
              uVar28 = (uint)*inData << ((byte)uVar11 & 0x1f);
              if (7 < (ushort)uVar11) {
                inData = inData + 1;
                uVar8 = (ushort)uVar11 - 8;
                uVar11 = (uint)uVar8;
                if (uVar8 == 0) {
                  uVar11 = 0;
                }
                else {
                  uVar28 = uVar28 | (uint)*inData << ((byte)uVar8 & 0x1f);
                }
              }
              uVar27 = uVar27 - uVar29;
              bVar12 = (byte)uVar20;
              uVar20 = (uVar20 & 0xffff) + (uVar29 & 0xffff);
              uVar16 = uVar16 | (~(-1 << ((byte)uVar29 & 0x1f)) & uVar28 >> 8) << (bVar12 & 0x1f);
            } while ((short)uVar27 != 0);
            uVar14 = (ulong)(uVar16 & 0xffff);
          }
          *outData = pUVar25[uVar14];
          outData = outData + 1;
        } while (outData < pUVar22);
      }
    }
LAB_0010fb88:
    UVar26 = '\0';
    bVar7 = true;
  }
LAB_0010fb8a:
  if (bVar7) {
    UVar26 = '\0';
  }
  return UVar26;
}

Assistant:

UINT8 DecompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Decompress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Decompress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	case 0x01:	// Delta-PCM
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Decompress_DPCM_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Decompress_DPCM_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}